

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O1

void getKktFailures(HighsOptions *options,HighsLp *lp,
                   vector<double,_std::allocator<double>_> *gradient,HighsSolution *solution,
                   HighsBasis *basis,HighsInfo *highs_info,HighsPrimalDualErrors *primal_dual_errors
                   ,bool get_residuals)

{
  HighsInt *pHVar1;
  double dVar2;
  double dVar3;
  pointer pHVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  bool bVar8;
  int iVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  char *pcVar13;
  double *pdVar14;
  vector<double,_std::allocator<double>_> *pvVar15;
  long lVar16;
  ulong uVar17;
  double *pdVar18;
  double *pdVar19;
  uint uVar20;
  ulong uVar21;
  HighsInt iCol;
  int iVar22;
  long lVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double absolute_primal_infeasibility;
  double value_residual;
  double dual_infeasibility;
  vector<double,_std::allocator<double>_> dual_negative_sum;
  vector<double,_std::allocator<double>_> dual_positive_sum;
  vector<double,_std::allocator<double>_> primal_negative_sum;
  vector<double,_std::allocator<double>_> primal_positive_sum;
  double relative_primal_infeasibility;
  double check_sum_complementarity_violations;
  double check_max_complementarity_violation;
  HighsBasisStatus local_16e;
  char local_16d;
  undefined4 local_16c;
  double *local_168;
  double *local_160;
  HighsBasis *local_158;
  double local_150;
  value_type_conflict1 local_148;
  double *local_140;
  double *local_138;
  double *local_130;
  double *local_128;
  HighsOptions *local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  vector<double,_std::allocator<double>_> local_f8;
  vector<double,_std::allocator<double>_> local_d8;
  vector<double,_std::allocator<double>_> local_b8;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> *local_80;
  pointer local_78;
  pointer local_70;
  HighsBasisStatus *local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_150 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
  local_118 = (options->super_HighsOptionsStruct).dual_feasibility_tolerance;
  local_160 = &(highs_info->super_HighsInfoStruct).max_primal_infeasibility;
  local_168 = &(highs_info->super_HighsInfoStruct).max_dual_infeasibility;
  (highs_info->super_HighsInfoStruct).num_primal_infeasibilities = -1;
  (highs_info->super_HighsInfoStruct).max_primal_infeasibility = INFINITY;
  (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities = INFINITY;
  (primal_dual_errors->max_primal_infeasibility).absolute_value = INFINITY;
  (primal_dual_errors->max_primal_infeasibility).absolute_index = -1;
  (primal_dual_errors->max_primal_infeasibility).relative_value = INFINITY;
  (primal_dual_errors->max_primal_infeasibility).relative_index = -1;
  (highs_info->super_HighsInfoStruct).primal_solution_status = 0;
  (highs_info->super_HighsInfoStruct).num_dual_infeasibilities = -1;
  (highs_info->super_HighsInfoStruct).max_dual_infeasibility = INFINITY;
  (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities = INFINITY;
  (primal_dual_errors->max_dual_infeasibility).absolute_value = INFINITY;
  (primal_dual_errors->max_dual_infeasibility).absolute_index = -1;
  (primal_dual_errors->max_dual_infeasibility).relative_value = INFINITY;
  (primal_dual_errors->max_dual_infeasibility).relative_index = -1;
  (highs_info->super_HighsInfoStruct).dual_solution_status = 0;
  (highs_info->super_HighsInfoStruct).max_complementarity_violation = INFINITY;
  (highs_info->super_HighsInfoStruct).sum_complementarity_violations = INFINITY;
  local_70 = (lp->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_78 = (lp->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  bVar8 = solution->value_valid;
  if (bVar8 == true) {
    (highs_info->super_HighsInfoStruct).num_primal_infeasibilities = 0;
    *local_160 = 0.0;
    (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities = 0.0;
    (primal_dual_errors->max_primal_infeasibility).absolute_value = 0.0;
    (primal_dual_errors->max_primal_infeasibility).absolute_index = 0;
    (primal_dual_errors->max_primal_infeasibility).relative_value = 0.0;
    (primal_dual_errors->max_primal_infeasibility).relative_index = 0;
    if (solution->dual_valid == true) {
      (highs_info->super_HighsInfoStruct).num_dual_infeasibilities = 0;
      *local_168 = 0.0;
      (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities = 0.0;
      (primal_dual_errors->max_dual_infeasibility).absolute_value = 0.0;
      (primal_dual_errors->max_dual_infeasibility).absolute_index = 0;
      (primal_dual_errors->max_dual_infeasibility).relative_value = 0.0;
      (primal_dual_errors->max_dual_infeasibility).relative_index = 0;
    }
  }
  iVar11 = (byte)(bVar8 & get_residuals) - 1;
  dVar24 = 0.0;
  dVar25 = 0.0;
  if ((bVar8 & get_residuals) == 0) {
    dVar25 = INFINITY;
  }
  primal_dual_errors->num_primal_residual = iVar11;
  (primal_dual_errors->max_primal_residual).absolute_value = dVar25;
  primal_dual_errors->sum_primal_residual = dVar25;
  (primal_dual_errors->max_primal_residual).absolute_index = iVar11;
  (primal_dual_errors->max_primal_residual).relative_value = dVar25;
  (primal_dual_errors->max_primal_residual).relative_index = iVar11;
  bVar10 = solution->dual_valid & get_residuals;
  iVar11 = bVar10 - 1;
  dVar25 = 0.0;
  if (bVar10 == 0) {
    dVar25 = INFINITY;
  }
  primal_dual_errors->num_dual_residual = iVar11;
  (primal_dual_errors->max_dual_residual).absolute_value = dVar25;
  primal_dual_errors->sum_dual_residual = dVar25;
  (primal_dual_errors->max_dual_residual).absolute_index = iVar11;
  (primal_dual_errors->max_dual_residual).relative_value = dVar25;
  (primal_dual_errors->max_dual_residual).relative_index = iVar11;
  iVar11 = basis->valid - 1;
  if (basis->valid == false) {
    dVar24 = INFINITY;
  }
  primal_dual_errors->num_nonzero_basic_duals = iVar11;
  primal_dual_errors->num_large_nonzero_basic_duals = iVar11;
  primal_dual_errors->max_nonzero_basic_dual = dVar24;
  primal_dual_errors->sum_nonzero_basic_duals = dVar24;
  primal_dual_errors->num_off_bound_nonbasic = iVar11;
  primal_dual_errors->max_off_bound_nonbasic = dVar24;
  primal_dual_errors->sum_off_bound_nonbasic = dVar24;
  if (bVar8 == false) {
    return;
  }
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_158 = basis;
  local_120 = options;
  local_80 = gradient;
  if (get_residuals) {
    local_148 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&local_98,(long)lp->num_row_,&local_148);
    local_148 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&local_b8,(long)lp->num_row_,&local_148);
    if (solution->dual_valid == true) {
      std::vector<double,_std::allocator<double>_>::resize(&local_d8,(long)lp->num_col_);
      std::vector<double,_std::allocator<double>_>::resize(&local_f8,(long)lp->num_col_);
    }
  }
  local_16e = kNonbasic;
  local_68 = &local_16e;
  if (local_158->valid == false) {
    local_68 = (HighsBasisStatus *)0x0;
  }
  uVar20 = lp->num_col_;
  uVar21 = (ulong)uVar20;
  uVar12 = lp->num_row_ + uVar20;
  uVar17 = (ulong)uVar12;
  if (uVar12 != 0 && SCARRY4(lp->num_row_,uVar20) == (int)uVar12 < 0) {
    local_138 = &primal_dual_errors->max_nonzero_basic_dual;
    local_140 = &primal_dual_errors->sum_nonzero_basic_duals;
    local_128 = &primal_dual_errors->max_off_bound_nonbasic;
    local_130 = &primal_dual_errors->sum_off_bound_nonbasic;
    local_120 = (HighsOptions *)&(local_120->super_HighsOptionsStruct).log_options;
    local_16d = !get_residuals;
    lVar23 = 0;
    local_50 = 0.0;
    local_16c = 0;
    do {
      iVar11 = (int)uVar21;
      iVar22 = (int)lVar23;
      if (lVar23 < iVar11) {
        if (solution->dual_valid == true) {
          local_50 = (solution->col_dual).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar23];
        }
        if (local_158->valid == true) {
          local_16e = (local_158->col_status).
                      super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar23];
        }
        local_58 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar23];
        local_60 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar23];
        local_110 = (solution->col_value).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar23];
        if (local_78 != local_70) {
          pHVar4 = (lp->integrality_).
                   super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_16c = (undefined4)CONCAT71((int7)((ulong)pHVar4 >> 8),pHVar4[lVar23]);
        }
      }
      else {
        iVar9 = iVar22 - iVar11;
        if (solution->dual_valid == true) {
          local_50 = (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar9];
        }
        local_58 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar9];
        local_60 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar9];
        local_110 = (solution->row_value).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar9];
        if (local_158->valid == true) {
          local_16e = (local_158->row_status).
                      super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                      _M_impl.super__Vector_impl_data._M_start[iVar9];
        }
        local_16c = 0;
      }
      local_50 = (double)lp->sense_ * local_50;
      bVar8 = getVariableKktFailures
                        (local_150,local_58,local_58,local_60,local_110,local_50,local_68,
                         (HighsVarType)local_16c,&local_148,&local_48,&local_100,&local_108);
      if (!bVar8) {
        pcVar13 = "Row   ";
        if (lVar23 < iVar11) {
          pcVar13 = "Column";
          iVar11 = 0;
        }
        highsLogUser((HighsLogOptions *)local_120,kError,
                     "getKktFailures: %s %d status-value error: [%23.18g; %23.18g; %23.18g] has residual %g\n"
                     ,local_58,local_110,local_60,local_108,pcVar13,(ulong)(uint)(iVar22 - iVar11));
      }
      if (local_150 < local_148) {
        pHVar1 = &(highs_info->super_HighsInfoStruct).num_primal_infeasibilities;
        *pHVar1 = *pHVar1 + 1;
      }
      if (*local_160 <= local_148 && local_148 != *local_160) {
        (primal_dual_errors->max_primal_infeasibility).absolute_index = iVar22;
        *local_160 = local_148;
      }
      pdVar14 = &(primal_dual_errors->max_primal_infeasibility).relative_value;
      if (*pdVar14 <= local_48 && local_48 != *pdVar14) {
        (primal_dual_errors->max_primal_infeasibility).relative_index = iVar22;
        (primal_dual_errors->max_primal_infeasibility).relative_value = local_48;
      }
      (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities =
           local_148 + (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities;
      bVar8 = solution->dual_valid;
      if (bVar8 == true) {
        if (local_118 < local_100) {
          pHVar1 = &(highs_info->super_HighsInfoStruct).num_dual_infeasibilities;
          *pHVar1 = *pHVar1 + 1;
        }
        if (*local_168 <= local_100 && local_100 != *local_168) {
          *local_168 = local_100;
          (primal_dual_errors->max_dual_infeasibility).absolute_index = iVar22;
        }
        (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities =
             local_100 + (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities;
      }
      if (local_158->valid == true) {
        if (local_16e == kBasic) {
          if (local_100 <= 0.0) goto LAB_00258ce5;
          primal_dual_errors->num_nonzero_basic_duals =
               primal_dual_errors->num_nonzero_basic_duals + 1;
          pdVar14 = local_138;
          pdVar18 = local_140;
          dVar24 = local_100;
          if (local_118 < local_100) {
            primal_dual_errors->num_large_nonzero_basic_duals =
                 primal_dual_errors->num_large_nonzero_basic_duals + 1;
          }
        }
        else {
          pdVar14 = local_128;
          pdVar18 = local_130;
          dVar24 = local_108;
          if (0.0 < local_108) {
            primal_dual_errors->num_off_bound_nonbasic =
                 primal_dual_errors->num_off_bound_nonbasic + 1;
          }
        }
        dVar25 = *pdVar14;
        if (*pdVar14 <= dVar24) {
          dVar25 = dVar24;
        }
        *pdVar14 = dVar25;
        *pdVar18 = dVar24 + *pdVar18;
      }
LAB_00258ce5:
      if (lVar23 < lp->num_col_ && local_16d == '\0') {
        if (bVar8 != false) {
          dVar24 = (local_80->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar23];
          dVar25 = -dVar24;
          pvVar15 = &local_f8;
          if (dVar25 < dVar24) {
            pvVar15 = &local_d8;
          }
          if (dVar24 <= dVar25) {
            dVar24 = dVar25;
          }
          (pvVar15->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar23] = dVar24;
        }
        piVar5 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar11 = piVar5[lVar23];
        lVar16 = (long)iVar11;
        iVar22 = piVar5[lVar23 + 1];
        if (iVar11 < iVar22) {
          piVar5 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar6 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar7 = (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            iVar11 = piVar5[lVar16];
            dVar24 = pdVar6[lVar16];
            dVar25 = local_110 * dVar24;
            if (dVar25 <= 0.0) {
              local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar11] =
                   local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar11] - dVar25;
            }
            else {
              local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar11] =
                   dVar25 + local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar11];
            }
            if (bVar8 != false) {
              dVar24 = dVar24 * -pdVar7[iVar11];
              if (dVar24 <= 0.0) {
                local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar23] =
                     local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar23] - dVar24;
              }
              else {
                local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar23] =
                     dVar24 + local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar23];
              }
            }
            lVar16 = lVar16 + 1;
          } while (iVar22 != lVar16);
        }
      }
      lVar23 = lVar23 + 1;
      uVar20 = lp->num_col_;
      uVar21 = (ulong)(int)uVar20;
      uVar17 = (long)lp->num_row_ + uVar21;
    } while (lVar23 < (long)uVar17);
  }
  bVar8 = solution->dual_valid;
  if (bVar8 != false) {
    (highs_info->super_HighsInfoStruct).max_complementarity_violation = 0.0;
    (highs_info->super_HighsInfoStruct).sum_complementarity_violations = 0.0;
    if (0 < (int)uVar17) {
      dVar24 = (highs_info->super_HighsInfoStruct).max_complementarity_violation;
      dVar25 = (highs_info->super_HighsInfoStruct).sum_complementarity_violations;
      lVar23 = (long)(int)uVar20;
      uVar21 = 0;
      do {
        lVar16 = uVar21 - lVar23;
        pdVar14 = (solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar16;
        if ((long)uVar21 < lVar23) {
          pdVar14 = (solution->col_value).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar21;
        }
        dVar26 = *pdVar14;
        pdVar19 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar16;
        pdVar14 = (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar16;
        pdVar18 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar16;
        if ((long)uVar21 < lVar23) {
          pdVar19 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar21;
          pdVar14 = (solution->col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start + uVar21;
          pdVar18 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar21;
        }
        dVar2 = *pdVar18;
        dVar3 = *pdVar19;
        if ((-INFINITY < dVar2) || (dVar27 = 1.0, dVar3 < INFINITY)) {
          if ((dVar2 + dVar3) * 0.5 <= dVar26) {
            dVar27 = ABS(dVar3 - dVar26);
          }
          else {
            dVar27 = ABS(dVar2 - dVar26);
          }
        }
        dVar27 = ABS(*pdVar14) * dVar27;
        dVar25 = dVar25 + dVar27;
        (highs_info->super_HighsInfoStruct).sum_complementarity_violations = dVar25;
        if (dVar24 <= dVar27) {
          dVar24 = dVar27;
        }
        (highs_info->super_HighsInfoStruct).max_complementarity_violation = dVar24;
        uVar21 = uVar21 + 1;
      } while (uVar21 != (uVar17 & 0xffffffff));
    }
    getComplementarityViolations(lp,solution,&local_38,&local_40);
  }
  if (get_residuals) {
    if (0 < lp->num_row_) {
      pdVar6 = (solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar23 = 0;
      do {
        dVar24 = pdVar6[lVar23];
        if (0.0 <= dVar24) {
          local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar23] =
               dVar24 + local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar23];
        }
        else {
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar23] =
               local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar23] - dVar24;
        }
        dVar24 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar23];
        dVar25 = local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar23];
        dVar26 = ABS(dVar24 - dVar25);
        if (1e-12 < dVar26) {
          primal_dual_errors->num_primal_residual = primal_dual_errors->num_primal_residual + 1;
        }
        if ((primal_dual_errors->max_primal_residual).absolute_value <= dVar26 &&
            dVar26 != (primal_dual_errors->max_primal_residual).absolute_value) {
          (primal_dual_errors->max_primal_residual).absolute_value = dVar26;
          (primal_dual_errors->max_primal_residual).absolute_index = (HighsInt)lVar23;
        }
        dVar24 = dVar26 / (dVar24 + 1.0 + dVar25);
        pdVar14 = &(primal_dual_errors->max_primal_residual).relative_value;
        if (*pdVar14 <= dVar24 && dVar24 != *pdVar14) {
          (primal_dual_errors->max_primal_residual).relative_value = dVar24;
          (primal_dual_errors->max_primal_residual).relative_index = (HighsInt)lVar23;
        }
        primal_dual_errors->sum_primal_residual = primal_dual_errors->sum_primal_residual + dVar26;
        lVar23 = lVar23 + 1;
      } while (lVar23 < lp->num_row_);
    }
    if (bVar8 == false) {
      (highs_info->super_HighsInfoStruct).primal_solution_status =
           ((highs_info->super_HighsInfoStruct).num_primal_infeasibilities == 0) + 1;
      goto LAB_00259180;
    }
    if (0 < lp->num_col_) {
      pdVar6 = (solution->col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar23 = 0;
      do {
        dVar24 = pdVar6[lVar23];
        if (0.0 <= dVar24) {
          local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar23] =
               dVar24 + local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar23];
        }
        else {
          local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar23] =
               local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar23] - dVar24;
        }
        dVar24 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar23];
        dVar25 = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar23];
        dVar26 = ABS(dVar24 - dVar25);
        if (1e-12 < dVar26) {
          primal_dual_errors->num_dual_residual = primal_dual_errors->num_dual_residual + 1;
        }
        if ((primal_dual_errors->max_dual_residual).absolute_value <= dVar26 &&
            dVar26 != (primal_dual_errors->max_dual_residual).absolute_value) {
          (primal_dual_errors->max_dual_residual).absolute_value = dVar26;
          (primal_dual_errors->max_dual_residual).absolute_index = (HighsInt)lVar23;
        }
        dVar24 = dVar26 / (dVar24 + 1.0 + dVar25);
        pdVar14 = &(primal_dual_errors->max_dual_residual).relative_value;
        if (*pdVar14 <= dVar24 && dVar24 != *pdVar14) {
          (primal_dual_errors->max_dual_residual).relative_value = dVar24;
          (primal_dual_errors->max_dual_residual).relative_index = (HighsInt)lVar23;
        }
        primal_dual_errors->sum_dual_residual = primal_dual_errors->sum_dual_residual + dVar26;
        lVar23 = lVar23 + 1;
      } while (lVar23 < lp->num_col_);
    }
  }
  (highs_info->super_HighsInfoStruct).primal_solution_status =
       ((highs_info->super_HighsInfoStruct).num_primal_infeasibilities == 0) + 1;
  if (bVar8 != false) {
    if ((highs_info->super_HighsInfoStruct).num_dual_infeasibilities == 0) {
      (highs_info->super_HighsInfoStruct).dual_solution_status = 2;
    }
    else {
      (highs_info->super_HighsInfoStruct).dual_solution_status = 1;
    }
  }
LAB_00259180:
  (primal_dual_errors->max_primal_infeasibility).absolute_value = *local_160;
  dVar24 = *local_168;
  (primal_dual_errors->max_dual_infeasibility).absolute_value = dVar24;
  (primal_dual_errors->max_dual_infeasibility).relative_value = dVar24;
  (primal_dual_errors->max_dual_infeasibility).relative_index =
       (primal_dual_errors->max_dual_infeasibility).absolute_index;
  if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void getKktFailures(const HighsOptions& options, const HighsLp& lp,
                    const std::vector<double>& gradient,
                    const HighsSolution& solution, const HighsBasis& basis,
                    HighsInfo& highs_info,
                    HighsPrimalDualErrors& primal_dual_errors,
                    const bool get_residuals) {
  double primal_feasibility_tolerance = options.primal_feasibility_tolerance;
  double dual_feasibility_tolerance = options.dual_feasibility_tolerance;
  // highs_info are the values computed in this method.

  HighsInt& num_primal_infeasibility = highs_info.num_primal_infeasibilities;

  HighsInt& max_absolute_primal_infeasibility_index =
      primal_dual_errors.max_primal_infeasibility.absolute_index;
  double& max_absolute_primal_infeasibility_value =
      highs_info.max_primal_infeasibility;
  HighsInt& max_relative_primal_infeasibility_index =
      primal_dual_errors.max_primal_infeasibility.relative_index;
  double& max_relative_primal_infeasibility_value =
      primal_dual_errors.max_primal_infeasibility.relative_value;

  double& sum_primal_infeasibility = highs_info.sum_primal_infeasibilities;

  HighsInt& num_dual_infeasibility = highs_info.num_dual_infeasibilities;

  HighsInt& max_dual_infeasibility_index =
      primal_dual_errors.max_dual_infeasibility.absolute_index;
  double& max_dual_infeasibility_value = highs_info.max_dual_infeasibility;

  double& sum_dual_infeasibility = highs_info.sum_dual_infeasibilities;

  double& max_complementarity_violation =
      highs_info.max_complementarity_violation;
  double& sum_complementarity_violations =
      highs_info.sum_complementarity_violations;

  num_primal_infeasibility = kHighsIllegalInfeasibilityCount;
  max_absolute_primal_infeasibility_value = kHighsIllegalInfeasibilityMeasure;
  sum_primal_infeasibility = kHighsIllegalInfeasibilityMeasure;
  primal_dual_errors.max_primal_infeasibility.invalidate();
  highs_info.primal_solution_status = kSolutionStatusNone;

  num_dual_infeasibility = kHighsIllegalInfeasibilityCount;
  max_dual_infeasibility_value = kHighsIllegalInfeasibilityMeasure;
  sum_dual_infeasibility = kHighsIllegalInfeasibilityMeasure;

  primal_dual_errors.max_dual_infeasibility.invalidate();
  highs_info.dual_solution_status = kSolutionStatusNone;

  max_complementarity_violation = kHighsIllegalComplementarityViolation;
  sum_complementarity_violations = kHighsIllegalComplementarityViolation;

  const bool& have_primal_solution = solution.value_valid;
  const bool& have_dual_solution = solution.dual_valid;
  const bool& have_basis = basis.valid;
  const bool have_integrality = (lp.integrality_.size() != 0);
  // Check that there is no dual solution if there's no primal solution
  assert(have_primal_solution || !have_dual_solution);
  // Check that there is no basis if there's no dual solution
  assert(have_dual_solution || !have_basis);

  if (have_primal_solution) {
    // There's a primal solution, so check its size and initialise the
    // infeasibility counts
    assert((int)solution.col_value.size() >= lp.num_col_);
    assert((int)solution.row_value.size() >= lp.num_row_);
    num_primal_infeasibility = 0;
    max_absolute_primal_infeasibility_value = 0;
    sum_primal_infeasibility = 0;
    primal_dual_errors.max_primal_infeasibility.reset();
    if (have_dual_solution) {
      // There's a dual solution, so check its size and initialise the
      // infeasibility counts
      assert((int)solution.col_dual.size() >= lp.num_col_);
      assert((int)solution.row_dual.size() >= lp.num_row_);
      num_dual_infeasibility = 0;
      max_dual_infeasibility_value = 0;
      sum_dual_infeasibility = 0;
      primal_dual_errors.max_dual_infeasibility.reset();
    }
  }

  HighsInt& num_primal_residual = primal_dual_errors.num_primal_residual;

  HighsInt& max_absolute_primal_residual_index =
      primal_dual_errors.max_primal_residual.absolute_index;
  double& max_absolute_primal_residual_value =
      primal_dual_errors.max_primal_residual.absolute_value;
  HighsInt& max_relative_primal_residual_index =
      primal_dual_errors.max_primal_residual.relative_index;
  double& max_relative_primal_residual_value =
      primal_dual_errors.max_primal_residual.relative_value;

  double& sum_primal_residual = primal_dual_errors.sum_primal_residual;

  HighsInt& num_dual_residual = primal_dual_errors.num_dual_residual;

  HighsInt& max_absolute_dual_residual_index =
      primal_dual_errors.max_dual_residual.absolute_index;
  double& max_absolute_dual_residual_value =
      primal_dual_errors.max_dual_residual.absolute_value;
  HighsInt& max_relative_dual_residual_index =
      primal_dual_errors.max_dual_residual.relative_index;
  double& max_relative_dual_residual_value =
      primal_dual_errors.max_dual_residual.relative_value;

  double& sum_dual_residual = primal_dual_errors.sum_dual_residual;

  HighsInt& num_nonzero_basic_duals =
      primal_dual_errors.num_nonzero_basic_duals;
  HighsInt& num_large_nonzero_basic_duals =
      primal_dual_errors.num_large_nonzero_basic_duals;
  double& max_nonzero_basic_dual = primal_dual_errors.max_nonzero_basic_dual;
  double& sum_nonzero_basic_duals = primal_dual_errors.sum_nonzero_basic_duals;

  HighsInt& num_off_bound_nonbasic = primal_dual_errors.num_off_bound_nonbasic;
  double& max_off_bound_nonbasic = primal_dual_errors.max_off_bound_nonbasic;
  double& sum_off_bound_nonbasic = primal_dual_errors.sum_off_bound_nonbasic;

  // Initialise HighsPrimalDualErrors

  if (have_primal_solution && get_residuals) {
    num_primal_residual = 0;
    max_absolute_primal_residual_value = 0;
    sum_primal_residual = 0;
    primal_dual_errors.max_primal_residual.reset();
  } else {
    num_primal_residual = kHighsIllegalInfeasibilityCount;
    max_absolute_primal_residual_value = kHighsIllegalInfeasibilityMeasure;
    sum_primal_residual = kHighsIllegalInfeasibilityMeasure;
    primal_dual_errors.max_primal_residual.invalidate();
  }
  if (have_dual_solution && get_residuals) {
    num_dual_residual = 0;
    max_absolute_dual_residual_value = 0;
    sum_dual_residual = 0;
    primal_dual_errors.max_dual_residual.reset();
  } else {
    num_dual_residual = kHighsIllegalInfeasibilityCount;
    max_absolute_dual_residual_value = kHighsIllegalInfeasibilityMeasure;
    sum_dual_residual = kHighsIllegalInfeasibilityMeasure;
    primal_dual_errors.max_dual_residual.invalidate();
  }
  if (have_basis) {
    num_nonzero_basic_duals = 0;
    num_large_nonzero_basic_duals = 0;
    max_nonzero_basic_dual = 0;
    sum_nonzero_basic_duals = 0;

    num_off_bound_nonbasic = 0;
    max_off_bound_nonbasic = 0;
    sum_off_bound_nonbasic = 0;
  } else {
    num_nonzero_basic_duals = kHighsIllegalInfeasibilityCount;
    num_large_nonzero_basic_duals = kHighsIllegalInfeasibilityCount;
    max_nonzero_basic_dual = kHighsIllegalInfeasibilityMeasure;
    sum_nonzero_basic_duals = kHighsIllegalInfeasibilityMeasure;

    num_off_bound_nonbasic = kHighsIllegalInfeasibilityCount;
    max_off_bound_nonbasic = kHighsIllegalInfeasibilityMeasure;
    sum_off_bound_nonbasic = kHighsIllegalInfeasibilityMeasure;
  }

  // Without a primal solution, nothing can be done!
  if (!have_primal_solution) return;
  std::vector<double> primal_positive_sum;
  std::vector<double> primal_negative_sum;
  std::vector<double> dual_positive_sum;
  std::vector<double> dual_negative_sum;
  if (get_residuals) {
    primal_positive_sum.assign(lp.num_row_, 0);
    primal_negative_sum.assign(lp.num_row_, 0);
    if (have_dual_solution) {
      dual_positive_sum.resize(lp.num_col_);
      dual_negative_sum.resize(lp.num_col_);
    }
  }

  // Set status to a value so the compiler doesn't think it might be unassigned.
  HighsBasisStatus status = HighsBasisStatus::kNonbasic;
  // Set status_pointer to be NULL unless we have a basis, in which
  // case it's the pointer to status. Can't make it a pointer to the
  // entry of basis since this is const.
  const HighsBasisStatus* status_pointer = have_basis ? &status : NULL;

  double absolute_primal_infeasibility;
  double relative_primal_infeasibility;
  double dual_infeasibility;
  double value_residual;
  double lower;
  double upper;
  double value;
  double dual = 0;
  HighsVarType integrality = HighsVarType::kContinuous;
  for (HighsInt iVar = 0; iVar < lp.num_col_ + lp.num_row_; iVar++) {
    if (iVar < lp.num_col_) {
      HighsInt iCol = iVar;
      lower = lp.col_lower_[iCol];
      upper = lp.col_upper_[iCol];
      value = solution.col_value[iCol];
      if (have_dual_solution) dual = solution.col_dual[iCol];
      if (have_basis) status = basis.col_status[iCol];
      if (have_integrality) integrality = lp.integrality_[iCol];
    } else {
      HighsInt iRow = iVar - lp.num_col_;
      lower = lp.row_lower_[iRow];
      upper = lp.row_upper_[iRow];
      value = solution.row_value[iRow];
      // @FlipRowDual -solution.row_dual[iRow]; became solution.row_dual[iRow];
      if (have_dual_solution) dual = solution.row_dual[iRow];
      if (have_basis) status = basis.row_status[iRow];
      integrality = HighsVarType::kContinuous;
    }
    // Flip dual according to lp.sense_
    dual *= (HighsInt)lp.sense_;

    const bool status_value_ok = getVariableKktFailures(
        primal_feasibility_tolerance, dual_feasibility_tolerance, lower, upper,
        value, dual, status_pointer, integrality, absolute_primal_infeasibility,
        relative_primal_infeasibility, dual_infeasibility, value_residual);
    if (!status_value_ok)
      highsLogUser(options.log_options, HighsLogType::kError,
                   "getKktFailures: %s %d status-value error: [%23.18g; "
                   "%23.18g; %23.18g] has "
                   "residual %g\n",
                   iVar < lp.num_col_ ? "Column" : "Row   ",
                   iVar < lp.num_col_ ? int(iVar) : int(iVar - lp.num_col_),
                   lower, value, upper, value_residual);
    assert(status_value_ok);
    // Accumulate primal infeasibilities
    if (absolute_primal_infeasibility > primal_feasibility_tolerance)
      num_primal_infeasibility++;
    if (max_absolute_primal_infeasibility_value <
        absolute_primal_infeasibility) {
      max_absolute_primal_infeasibility_index = iVar;
      max_absolute_primal_infeasibility_value = absolute_primal_infeasibility;
    }
    if (max_relative_primal_infeasibility_value <
        relative_primal_infeasibility) {
      max_relative_primal_infeasibility_index = iVar;
      max_relative_primal_infeasibility_value = relative_primal_infeasibility;
    }
    sum_primal_infeasibility += absolute_primal_infeasibility;

    if (have_dual_solution) {
      // Accumulate dual infeasibilities
      if (dual_infeasibility > dual_feasibility_tolerance)
        num_dual_infeasibility++;
      if (max_dual_infeasibility_value < dual_infeasibility) {
        max_dual_infeasibility_value = dual_infeasibility;
        max_dual_infeasibility_index = iVar;
      }
      sum_dual_infeasibility += dual_infeasibility;
    }
    if (have_basis) {
      if (status == HighsBasisStatus::kBasic) {
        double abs_basic_dual = dual_infeasibility;
        if (abs_basic_dual > 0) {
          num_nonzero_basic_duals++;
          if (abs_basic_dual > dual_feasibility_tolerance)
            num_large_nonzero_basic_duals++;
          max_nonzero_basic_dual =
              std::max(abs_basic_dual, max_nonzero_basic_dual);
          sum_nonzero_basic_duals += abs_basic_dual;
        }
      } else {
        double off_bound_nonbasic = value_residual;
        if (off_bound_nonbasic > 0) num_off_bound_nonbasic++;
        max_off_bound_nonbasic =
            std::max(off_bound_nonbasic, max_off_bound_nonbasic);
        sum_off_bound_nonbasic += off_bound_nonbasic;
      }
    }
    if (iVar < lp.num_col_ && get_residuals) {
      HighsInt iCol = iVar;
      if (have_dual_solution) {
        if (gradient[iCol] > 0) {
          dual_positive_sum[iCol] = gradient[iCol];
        } else {
          dual_negative_sum[iCol] = -gradient[iCol];
        }
      }
      for (HighsInt el = lp.a_matrix_.start_[iCol];
           el < lp.a_matrix_.start_[iCol + 1]; el++) {
        HighsInt iRow = lp.a_matrix_.index_[el];
        double Avalue = lp.a_matrix_.value_[el];
        double term = value * Avalue;
        if (term > 0) {
          primal_positive_sum[iRow] += term;
        } else {
          primal_negative_sum[iRow] -= term;
        }
        // @FlipRowDual += became -=
        if (have_dual_solution) {
          double term = -solution.row_dual[iRow] * Avalue;
          if (term > 0) {
            dual_positive_sum[iCol] += term;
          } else {
            dual_negative_sum[iCol] -= term;
          }
        }
      }
    }
  }

  if (have_dual_solution) {
    // Determine the sum of complementarity violations
    max_complementarity_violation = 0;
    sum_complementarity_violations = 0;
    double primal_residual = 0;
    for (HighsInt iVar = 0; iVar < lp.num_col_ + lp.num_row_; iVar++) {
      const bool is_col = iVar < lp.num_col_;
      const HighsInt iRow = iVar - lp.num_col_;
      const double primal =
          is_col ? solution.col_value[iVar] : solution.row_value[iRow];
      const double dual =
          is_col ? solution.col_dual[iVar] : solution.row_dual[iRow];
      const double lower = is_col ? lp.col_lower_[iVar] : lp.row_lower_[iRow];
      const double upper = is_col ? lp.col_upper_[iVar] : lp.row_upper_[iRow];
      if (lower <= -kHighsInf && upper >= kHighsInf) {
        // Free
        primal_residual = 1;
      } else {
        const double mid = (lower + upper) * 0.5;
        primal_residual = primal < mid ? std::fabs(lower - primal)
                                       : std::fabs(upper - primal);
      }
      const double dual_residual = std::fabs(dual);
      const double complementarity_violation = primal_residual * dual_residual;
      sum_complementarity_violations += complementarity_violation;
      max_complementarity_violation =
          std::max(complementarity_violation, max_complementarity_violation);
    }
    double check_max_complementarity_violation;
    double check_sum_complementarity_violations;
    const bool have_values = getComplementarityViolations(
        lp, solution, check_max_complementarity_violation,
        check_sum_complementarity_violations);
    assert(have_values);
    assert(check_max_complementarity_violation ==
           max_complementarity_violation);
    assert(check_sum_complementarity_violations ==
           sum_complementarity_violations);
  }

  if (get_residuals) {
    const double large_residual_error = 1e-12;
    for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
      double term = -solution.row_value[iRow];
      if (term > 0) {
        primal_positive_sum[iRow] += term;
      } else {
        primal_negative_sum[iRow] -= term;
      }
      assert(primal_positive_sum[iRow] >= 0);
      assert(primal_negative_sum[iRow] >= 0);
      double absolute_primal_residual =
          std::fabs(primal_positive_sum[iRow] - primal_negative_sum[iRow]);
      double relative_primal_residual =
          absolute_primal_residual /
          (1 + primal_positive_sum[iRow] + primal_negative_sum[iRow]);

      if (absolute_primal_residual > large_residual_error)
        num_primal_residual++;
      if (max_absolute_primal_residual_value < absolute_primal_residual) {
        max_absolute_primal_residual_value = absolute_primal_residual;
        max_absolute_primal_residual_index = iRow;
      }
      if (max_relative_primal_residual_value < relative_primal_residual) {
        max_relative_primal_residual_value = relative_primal_residual;
        max_relative_primal_residual_index = iRow;
      }
      sum_primal_residual += absolute_primal_residual;
    }
    if (have_dual_solution) {
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
        double term = -solution.col_dual[iCol];
        if (term > 0) {
          dual_positive_sum[iCol] += term;
        } else {
          dual_negative_sum[iCol] -= term;
        }
        assert(dual_positive_sum[iCol] >= 0);
        assert(dual_negative_sum[iCol] >= 0);
        double absolute_dual_residual =
            std::fabs(dual_positive_sum[iCol] - dual_negative_sum[iCol]);
        double relative_dual_residual =
            absolute_dual_residual /
            (1 + dual_positive_sum[iCol] + dual_negative_sum[iCol]);
        if (absolute_dual_residual > large_residual_error) num_dual_residual++;
        if (max_absolute_dual_residual_value < absolute_dual_residual) {
          max_absolute_dual_residual_value = absolute_dual_residual;
          max_absolute_dual_residual_index = iCol;
        }
        if (max_relative_dual_residual_value < relative_dual_residual) {
          max_relative_dual_residual_value = relative_dual_residual;
          max_relative_dual_residual_index = iCol;
        }
        sum_dual_residual += absolute_dual_residual;
      }
    }
  }
  // Assign primal solution status
  if (num_primal_infeasibility) {
    highs_info.primal_solution_status = kSolutionStatusInfeasible;
  } else {
    highs_info.primal_solution_status = kSolutionStatusFeasible;
  }
  if (have_dual_solution) {
    // Assign dual solution status
    if (num_dual_infeasibility) {
      highs_info.dual_solution_status = kSolutionStatusInfeasible;
    } else {
      highs_info.dual_solution_status = kSolutionStatusFeasible;
    }
  }
  // Assign the two entries in primal_dual_errors that are accumulated
  // in highs_info
  primal_dual_errors.max_primal_infeasibility.absolute_value =
      highs_info.max_primal_infeasibility;
  ;
  primal_dual_errors.max_dual_infeasibility.absolute_value =
      highs_info.max_dual_infeasibility;
  // Relative dual_infeasibility data is the same as absolute
  primal_dual_errors.max_dual_infeasibility.relative_value =
      primal_dual_errors.max_dual_infeasibility.absolute_value;
  primal_dual_errors.max_dual_infeasibility.relative_index =
      primal_dual_errors.max_dual_infeasibility.absolute_index;
}